

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

GLuint __thiscall gl4cts::GPUShaderFP64Test2::getMaxUniformBlockSize(GPUShaderFP64Test2 *this)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  GLuint local_1c;
  long lStack_18;
  GLint max_uniform_block_size;
  Functions *gl;
  GPUShaderFP64Test2 *this_local;
  
  gl = (Functions *)this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lStack_18 = CONCAT44(extraout_var,iVar1);
  local_1c = 0;
  (**(code **)(lStack_18 + 0x868))(0x8a30,&local_1c);
  err = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(err,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0xd9d);
  return local_1c;
}

Assistant:

glw::GLuint GPUShaderFP64Test2::getMaxUniformBlockSize() const
{
	const glw::Functions& gl					 = m_context.getRenderContext().getFunctions();
	glw::GLint			  max_uniform_block_size = 0;

	gl.getIntegerv(GL_MAX_UNIFORM_BLOCK_SIZE, &max_uniform_block_size);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

	return max_uniform_block_size;
}